

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool cmSystemTools::SimpleGlob
               (string *glob,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,int type)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  unsigned_long uVar4;
  char *pcVar5;
  long *extraout_RAX;
  long *plVar6;
  byte bVar7;
  uint uVar8;
  ulong dindex;
  Directory d;
  string fname;
  string path;
  string sfname;
  string ppath;
  allocator<char> local_f1;
  Directory local_f0;
  string local_e8;
  undefined8 local_c8;
  int local_bc;
  string local_b8;
  long *local_98;
  ulong local_90;
  long local_88 [2];
  string local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  local_bc = type;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(files,(files->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start);
  if ((glob->_M_dataplus)._M_p[glob->_M_string_length - 1] == '*') {
    cmsys::SystemTools::GetFilenamePath(&local_b8,glob);
    cmsys::SystemTools::GetFilenameName(&local_78,glob);
    std::__cxx11::string::substr((ulong)&local_e8,(ulong)&local_78);
    std::__cxx11::string::operator=((string *)&local_78,(string *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if (local_b8._M_string_length == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_b8,0,(char *)0x0,0x589dbd);
    }
    cmsys::Directory::Directory(&local_f0);
    bVar2 = cmsys::Directory::Load(&local_f0,&local_b8);
    uVar8 = 0;
    local_c8 = 0;
    if (bVar2) {
      local_c8 = 0;
      local_58 = files;
      while( true ) {
        uVar4 = cmsys::Directory::GetNumberOfFiles(&local_f0);
        dindex = (ulong)uVar8;
        if (uVar4 <= dindex) break;
        pcVar5 = cmsys::Directory::GetFile(&local_f0,dindex);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,pcVar5,(allocator<char> *)&local_50);
        iVar3 = std::__cxx11::string::compare((char *)&local_e8);
        if (iVar3 == 0) {
          bVar2 = false;
        }
        else {
          pcVar5 = cmsys::Directory::GetFile(&local_f0,dindex);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,pcVar5,&local_f1);
          iVar3 = std::__cxx11::string::compare((char *)&local_98);
          bVar2 = iVar3 != 0;
          if (local_98 != local_88) {
            operator_delete(local_98,local_88[0] + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if (bVar2) {
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e8,local_b8._M_dataplus._M_p,
                     local_b8._M_dataplus._M_p + local_b8._M_string_length);
          if (local_b8._M_dataplus._M_p[local_b8._M_string_length - 1] != '/') {
            std::__cxx11::string::append((char *)&local_e8);
          }
          cmsys::Directory::GetFile(&local_f0,dindex);
          std::__cxx11::string::append((char *)&local_e8);
          pcVar5 = cmsys::Directory::GetFile(&local_f0,dindex);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,pcVar5,(allocator<char> *)&local_50);
          if (local_bc < 1) {
            if ((-1 < local_bc) || (bVar2 = cmsys::SystemTools::FileIsDirectory(&local_e8), bVar2))
            goto LAB_00260404;
          }
          else {
            bVar2 = cmsys::SystemTools::FileIsDirectory(&local_e8);
            if (!bVar2) {
LAB_00260404:
              if (local_78._M_string_length <= local_90) {
                std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_98);
                plVar1 = local_50;
                if (local_48 == local_78._M_string_length) {
                  if (local_48 == 0) {
                    bVar2 = true;
                  }
                  else {
                    iVar3 = bcmp(local_50,local_78._M_dataplus._M_p,local_48);
                    bVar2 = iVar3 == 0;
                  }
                }
                else {
                  bVar2 = false;
                }
                plVar6 = local_40;
                if (plVar1 != plVar6) {
                  operator_delete(plVar1,local_40[0] + 1);
                  plVar6 = extraout_RAX;
                }
                if (bVar2) {
                  local_c8 = CONCAT71((int7)((ulong)plVar6 >> 8),1);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(local_58,&local_e8);
                }
              }
            }
          }
          if (local_98 != local_88) {
            operator_delete(local_98,local_88[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
        }
        uVar8 = uVar8 + 1;
      }
    }
    cmsys::Directory::~Directory(&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    bVar7 = (byte)local_c8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar7 = 0;
  }
  return (bool)(bVar7 & 1);
}

Assistant:

bool cmSystemTools::SimpleGlob(const std::string& glob,
                               std::vector<std::string>& files,
                               int type /* = 0 */)
{
  files.clear();
  if (glob.back() != '*') {
    return false;
  }
  std::string path = cmSystemTools::GetFilenamePath(glob);
  std::string ppath = cmSystemTools::GetFilenameName(glob);
  ppath = ppath.substr(0, ppath.size() - 1);
  if (path.empty()) {
    path = "/";
  }

  bool res = false;
  cmsys::Directory d;
  if (d.Load(path)) {
    for (unsigned int i = 0; i < d.GetNumberOfFiles(); ++i) {
      if ((std::string(d.GetFile(i)) != ".") &&
          (std::string(d.GetFile(i)) != "..")) {
        std::string fname = path;
        if (path.back() != '/') {
          fname += "/";
        }
        fname += d.GetFile(i);
        std::string sfname = d.GetFile(i);
        if (type > 0 && cmSystemTools::FileIsDirectory(fname)) {
          continue;
        }
        if (type < 0 && !cmSystemTools::FileIsDirectory(fname)) {
          continue;
        }
        if (sfname.size() >= ppath.size() &&
            sfname.substr(0, ppath.size()) == ppath) {
          files.push_back(fname);
          res = true;
        }
      }
    }
  }
  return res;
}